

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::TextureCubeArrayFormatCase::testLayerFace
          (TextureCubeArrayFormatCase *this,int layerFaceNdx)

{
  code *pcVar1;
  RenderContext *context;
  CubeFace face_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RGBA threshold_00;
  undefined4 extraout_var;
  TestLog *log_00;
  undefined4 extraout_var_00;
  char *pcVar7;
  undefined4 extraout_var_01;
  PixelFormat *pPVar8;
  TextureCubeArray *pTVar9;
  TextureFormat *pTVar10;
  reference pvVar11;
  undefined4 extraout_var_02;
  char *desc;
  TextureCubeArrayView TVar12;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  TextureCubeArrayView local_240;
  SurfaceAccess local_230;
  PixelBufferAccess local_210;
  Vector<float,_2> local_1e4;
  Vector<float,_2> local_1dc;
  Vector<float,_2> local_1d4;
  Vector<float,_4> local_1cc;
  Sampler local_1bc;
  TextureFormat local_180;
  CubeFace local_174;
  int local_170;
  CubeFace face;
  int layerNdx;
  TextureFormatInfo spec;
  ReferenceParams renderParams;
  vector<float,_std::allocator<float>_> texCoord;
  RGBA threshold;
  undefined1 local_68 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  TextureCubeArrayFormatCase *pTStack_10;
  int layerFaceNdx_local;
  TextureCubeArrayFormatCase *this_local;
  long lVar6;
  
  gl._4_4_ = layerFaceNdx;
  pTStack_10 = this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = this->m_size;
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar7);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,iVar3,dVar5);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_68,viewport.x,viewport.y);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tcu::PixelFormat::getColorThreshold(pPVar8);
  tcu::RGBA::RGBA((RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  threshold_00 = tcu::operator+((RGBA *)((long)&texCoord.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                (RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)(spec.lookupBias.m_data + 2),TEXTURETYPE_CUBE_ARRAY);
  pTVar9 = glu::TextureCubeArray::getRefTexture(this->m_texture);
  pTVar10 = tcu::TextureLevelPyramid::getFormat(&pTVar9->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&face,pTVar10);
  local_170 = gl._4_4_ / 6;
  local_174 = getCubeFaceFromNdx(gl._4_4_ % 6);
  pTVar9 = glu::TextureCubeArray::getRefTexture(this->m_texture);
  pTVar10 = tcu::TextureLevelPyramid::getFormat(&pTVar9->super_TextureLevelPyramid);
  local_180 = *pTVar10;
  spec.lookupBias.m_data[3] = (float)glu::TextureTestUtil::getSamplerType(local_180);
  tcu::Vector<float,_4>::Vector(&local_1cc,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_1bc,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,&local_1cc,false,MODE_DEPTH);
  tcu::Sampler::operator=
            ((Sampler *)(renderParams.super_RenderParams.colorBias.m_data + 2),&local_1bc);
  face_00 = local_174;
  renderParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
  renderParams.super_RenderParams.bias = spec.valueMax.m_data[2];
  renderParams.super_RenderParams.ref = spec.valueMax.m_data[3];
  renderParams.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  renderParams.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  renderParams.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  renderParams.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  renderParams.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  renderParams.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  tcu::Vector<float,_2>::Vector(&local_1d4,0.0,0.0);
  tcu::Vector<float,_2>::Vector(&local_1dc,1.0,1.0);
  tcu::Vector<float,_2>::Vector(&local_1e4,(float)local_170);
  glu::TextureTestUtil::computeQuadTexCoordCubeArray
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,face_00,&local_1d4,
             &local_1dc,&local_1e4);
  (**(code **)(lVar6 + 0x188))(0x4500);
  (**(code **)(lVar6 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  glu::TextureCubeArray::upload(this->m_texture);
  (**(code **)(lVar6 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar5 = glu::TextureCubeArray::getGLTexture(this->m_texture);
  (*pcVar1)(0x9009,dVar5);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0x9009,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFormatTests.cpp"
                  ,0xd7);
  pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar11,(RenderParams *)(spec.lookupBias.m_data + 2));
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_210,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_210);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar8 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess(&local_230,(Surface *)local_68,pPVar8);
  pTVar9 = glu::TextureCubeArray::getRefTexture(this->m_texture);
  TVar12 = tcu::TextureCubeArray::operator_cast_to_TextureCubeArrayView(pTVar9);
  local_240.m_levels = TVar12.m_levels;
  local_240.m_numLevels = TVar12.m_numLevels;
  pvVar11 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  glu::TextureTestUtil::sampleTexture
            (&local_230,&local_240,pvVar11,(ReferenceParams *)(spec.lookupBias.m_data + 2));
  de::toString<int>(&local_280,(int *)((long)&gl + 4));
  std::operator+(&local_260,"LayerFace",&local_280);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  de::toString<int>(&local_2c0,(int *)((long)&gl + 4));
  std::operator+(&local_2a0,"Layer-face ",&local_2c0);
  desc = (char *)std::__cxx11::string::c_str();
  bVar2 = glu::TextureTestUtil::compareImages
                    (log_00,pcVar7,desc,(Surface *)local_68,
                     (Surface *)&referenceFrame.m_pixels.m_cap,threshold_00);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return bVar2;
}

Assistant:

bool TextureCubeArrayFormatCase::testLayerFace (int layerFaceNdx)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	RandomViewport			viewport		(m_renderCtx.getRenderTarget(), m_size, m_size, deStringHash(getName()));
	tcu::Surface			renderedFrame	(viewport.width, viewport.height);
	tcu::Surface			referenceFrame	(viewport.width, viewport.height);
	tcu::RGBA				threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams	(TEXTURETYPE_CUBE_ARRAY);
	tcu::TextureFormatInfo	spec			= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());
	const int				layerNdx		= layerFaceNdx / 6;
	const tcu::CubeFace		face			= getCubeFaceFromNdx(layerFaceNdx % 6);

	renderParams.samplerType				= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler					= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.sampler.seamlessCubeMap	= true;
	renderParams.colorScale					= spec.lookupScale;
	renderParams.colorBias					= spec.lookupBias;

	// Layer here specifies the cube slice
	computeQuadTexCoordCubeArray(texCoord, face, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f), tcu::Vec2((float)layerNdx));

	// Setup base viewport.
	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, (string("LayerFace" + de::toString(layerFaceNdx))).c_str(), (string("Layer-face " + de::toString(layerFaceNdx))).c_str(), referenceFrame, renderedFrame, threshold);
}